

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::ReservoirQuantileScalarOperation::
     Finalize<double,duckdb::ReservoirQuantileState<double>>
               (ReservoirQuantileState<double> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  reference pvVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pdVar1 = state->v;
    lVar3 = state->pos - 1;
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    pvVar4 = vector<double,_true>::operator[]((vector<double,_true> *)((this->bind_data).ptr + 1),0)
    ;
    dVar6 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * *pvVar4;
    uVar5 = (ulong)dVar6;
    uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    uVar2 = state->pos;
    if ((uVar2 != 0) && (uVar2 != uVar5)) {
      lVar3 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      ::std::__introselect<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pdVar1,pdVar1 + uVar5,pdVar1 + uVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    }
    *target = pdVar1[uVar5];
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.v);
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();
		auto v_t = state.v;
		D_ASSERT(bind_data.quantiles.size() == 1);
		auto offset = (idx_t)((double)(state.pos - 1) * bind_data.quantiles[0]);
		std::nth_element(v_t, v_t + offset, v_t + state.pos);
		target = v_t[offset];
	}